

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,DataType dataType)

{
  undefined1 local_190 [8];
  ostringstream source;
  DataType dataType_local;
  
  source._372_4_ = SUB84(this,0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  if ((((source._372_4_ == 0x2d) || (source._372_4_ == 0x33)) || (source._372_4_ == 0x3a)) ||
     (source._372_4_ == 0x41)) {
    std::operator<<((ostream *)local_190,"GL_EXT_texture_cube_map_array");
  }
  else if (source._372_4_ - 0x55 < 3) {
    std::operator<<((ostream *)local_190,"GL_EXT_texture_buffer");
  }
  else if (source._372_4_ - 0x58 < 3) {
    std::operator<<((ostream *)local_190,"GL_OES_texture_storage_multisample_2d_array");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string getDataTypeExtension (glu::DataType dataType)
{
	std::ostringstream source;
	switch (dataType)
	{
		case glu::TYPE_SAMPLER_CUBE_ARRAY:
		case glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW:
		case glu::TYPE_INT_SAMPLER_CUBE_ARRAY:
		case glu::TYPE_UINT_SAMPLER_CUBE_ARRAY:
			source << "GL_EXT_texture_cube_map_array";
			break;

		case glu::TYPE_SAMPLER_BUFFER:
		case glu::TYPE_INT_SAMPLER_BUFFER:
		case glu::TYPE_UINT_SAMPLER_BUFFER:
			source << "GL_EXT_texture_buffer";
			break;

		case glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY:
		case glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:
		case glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY:
			source << "GL_OES_texture_storage_multisample_2d_array";
			break;

		default:
			break;
	}

	return source.str();
}